

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Tracks::~Tracks(Tracks *this)

{
  Track **ppTVar1;
  Track *pTVar2;
  Track **ppTVar3;
  
  ppTVar3 = this->m_trackEntries;
  ppTVar1 = this->m_trackEntriesEnd;
  while (ppTVar3 != ppTVar1) {
    pTVar2 = *ppTVar3;
    ppTVar3 = ppTVar3 + 1;
    if (pTVar2 != (Track *)0x0) {
      (*pTVar2->_vptr_Track[1])();
    }
  }
  if (this->m_trackEntries != (Track **)0x0) {
    operator_delete__(this->m_trackEntries);
    return;
  }
  return;
}

Assistant:

Tracks::~Tracks() {
  Track** i = m_trackEntries;
  Track** const j = m_trackEntriesEnd;

  while (i != j) {
    Track* const pTrack = *i++;
    delete pTrack;
  }

  delete[] m_trackEntries;
}